

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction_util.cpp
# Opt level: O2

void AddInputs(CMutableTransaction *rawTx,UniValue *inputs_in,optional<bool> rbf)

{
  long lVar1;
  string str;
  COutPoint prevoutIn;
  CScript scriptSigIn;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  uint32_t uVar10;
  UniValue *pUVar11;
  UniValue *this;
  ulong uVar12;
  undefined6 in_register_00000012;
  undefined4 uVar13;
  uint uVar14;
  long in_FS_OFFSET;
  string_view key;
  string_view key_00;
  string_view strKey;
  undefined8 in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe70;
  CTxIn in;
  Txid txid;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0 [16];
  UniValue inputs;
  
  uVar12 = CONCAT62(in_register_00000012,
                    rbf.super__Optional_base<bool,_true,_true>._M_payload.
                    super__Optional_payload_base<bool>) & 0xffffffff;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  inputs.val._M_dataplus._M_p = (pointer)&inputs.val.field_2;
  inputs.val._M_string_length = 0;
  inputs.val.field_2._M_local_buf[0] = '\0';
  inputs.typ = VNULL;
  inputs.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  inputs.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  inputs.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  inputs.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  inputs.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  inputs.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (inputs_in->typ == VNULL) {
    local_b0 = local_a0;
    local_a8 = 0;
    local_a0[0] = 0;
    str._M_string_length = in_stack_fffffffffffffe40;
    str._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe38;
    str.field_2._M_allocated_capacity = in_stack_fffffffffffffe48;
    str.field_2._8_8_ = in_stack_fffffffffffffe50;
    UniValue::UniValue((UniValue *)&in,VARR,str);
    UniValue::operator=(&inputs,(UniValue *)&in);
    UniValue::~UniValue((UniValue *)&in);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  else {
    pUVar11 = UniValue::get_array(inputs_in);
    UniValue::operator=(&inputs,pUVar11);
  }
  uVar13 = (undefined4)
           CONCAT71((int7)(uVar12 >> 8),
                    (byte)uVar12 |
                    ((uint)CONCAT62(in_register_00000012,
                                    rbf.super__Optional_base<bool,_true,_true>._M_payload.
                                    super__Optional_payload_base<bool>) >> 8 & 1) == 0);
  uVar14 = 0;
  do {
    if ((ulong)(((long)inputs.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                (long)inputs.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x58) <= (ulong)uVar14) {
      UniValue::~UniValue(&inputs);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
LAB_00aa6a95:
      __stack_chk_fail();
    }
    pUVar11 = UniValue::operator[](&inputs,(ulong)uVar14);
    pUVar11 = UniValue::get_obj(pUVar11);
    strKey._M_str = "txid";
    strKey._M_len = 4;
    ParseHashO((uint256 *)&in,pUVar11,strKey);
    uVar8 = in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_;
    uVar6 = in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_;
    uVar4 = in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_;
    uVar2 = in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_;
    key._M_str = "vout";
    key._M_len = 4;
    this = UniValue::find_value(pUVar11,key);
    if (this->typ != VNUM) {
      pUVar11 = (UniValue *)__cxa_allocate_exception(0x58);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&in,"Invalid parameter, missing vout key",
                 (allocator<char> *)&stack0xfffffffffffffe77);
      JSONRPCError(pUVar11,-8,(string *)&in);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(pUVar11,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_00aa6a95;
    }
    uVar10 = UniValue::getInt<int>(this);
    if ((int)uVar10 < 0) {
      pUVar11 = (UniValue *)__cxa_allocate_exception(0x58);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&in,"Invalid parameter, vout cannot be negative",
                 (allocator<char> *)&stack0xfffffffffffffe77);
      JSONRPCError(pUVar11,-8,(string *)&in);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(pUVar11,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_00aa6a95;
    }
    key_00._M_str = "sequence";
    key_00._M_len = 8;
    pUVar11 = UniValue::find_value(pUVar11,key_00);
    if ((pUVar11->typ == VNUM) && (uVar12 = UniValue::getInt<long>(pUVar11), uVar12 >> 0x20 != 0)) {
      pUVar11 = (UniValue *)__cxa_allocate_exception(0x58);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&in,"Invalid parameter, sequence number is out of range",
                 (allocator<char> *)&stack0xfffffffffffffe77);
      JSONRPCError(pUVar11,-8,(string *)&in);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(pUVar11,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_00aa6a95;
    }
    uVar9 = in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_;
    uVar7 = in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_;
    uVar5 = in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_;
    uVar3 = in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_;
    in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = (uchar)uVar4;
    in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = SUB81(uVar4,1);
    in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = SUB81(uVar4,2);
    in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = SUB81(uVar4,3);
    in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = SUB81(uVar4,4);
    in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = SUB81(uVar4,5);
    in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = SUB81(uVar4,6);
    in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = SUB81(uVar4,7);
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] =
         in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8];
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] =
         in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9];
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] =
         in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10];
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] =
         in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb];
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] =
         in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc];
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] =
         in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd];
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] =
         in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe];
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] =
         in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf];
    in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = (uchar)uVar2;
    in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = SUB81(uVar2,1);
    in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = SUB81(uVar2,2);
    in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = SUB81(uVar2,3);
    in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = SUB81(uVar2,4);
    in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = SUB81(uVar2,5);
    in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = SUB81(uVar2,6);
    in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = SUB81(uVar2,7);
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] =
         in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0];
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] =
         in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1];
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] =
         in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2];
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] =
         in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3];
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] =
         in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4];
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] =
         in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5];
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] =
         in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6];
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] =
         in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7];
    in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = (uchar)uVar6;
    in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = SUB81(uVar6,1);
    in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = SUB81(uVar6,2);
    in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = SUB81(uVar6,3);
    in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = SUB81(uVar6,4);
    in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = SUB81(uVar6,5);
    in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = SUB81(uVar6,6);
    in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = SUB81(uVar6,7);
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] =
         in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10];
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] =
         in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11];
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] =
         in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12];
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] =
         in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13];
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] =
         in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14];
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] =
         in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15];
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] =
         in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16];
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] =
         in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17];
    in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)uVar8;
    in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = SUB81(uVar8,1);
    in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = SUB81(uVar8,2);
    in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = SUB81(uVar8,3);
    in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = SUB81(uVar8,4);
    in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = SUB81(uVar8,5);
    in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = SUB81(uVar8,6);
    in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = SUB81(uVar8,7);
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] =
         in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18];
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] =
         in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19];
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] =
         in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a];
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] =
         in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b];
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] =
         in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c];
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] =
         in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d];
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] =
         in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e];
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] =
         in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f];
    prevoutIn.n = uVar10;
    scriptSigIn.super_CScriptBase._union._4_4_ = uVar13;
    scriptSigIn.super_CScriptBase._union._0_4_ = in_stack_fffffffffffffe60;
    scriptSigIn.super_CScriptBase._union._8_8_ = rawTx;
    scriptSigIn.super_CScriptBase._union._16_8_ = in_stack_fffffffffffffe70;
    scriptSigIn.super_CScriptBase._24_8_ = 0;
    in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = uVar3;
    in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ = uVar5;
    in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ = uVar7;
    in.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = uVar9;
    CTxIn::CTxIn(&in,prevoutIn,scriptSigIn,
                 (uint32_t)
                 (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&stack0xfffffffffffffe78);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&stack0xfffffffffffffe78);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::push_back(&rawTx->vin,&in);
    CTxIn::~CTxIn(&in);
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

void AddInputs(CMutableTransaction& rawTx, const UniValue& inputs_in, std::optional<bool> rbf)
{
    UniValue inputs;
    if (inputs_in.isNull()) {
        inputs = UniValue::VARR;
    } else {
        inputs = inputs_in.get_array();
    }

    for (unsigned int idx = 0; idx < inputs.size(); idx++) {
        const UniValue& input = inputs[idx];
        const UniValue& o = input.get_obj();

        Txid txid = Txid::FromUint256(ParseHashO(o, "txid"));

        const UniValue& vout_v = o.find_value("vout");
        if (!vout_v.isNum())
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, missing vout key");
        int nOutput = vout_v.getInt<int>();
        if (nOutput < 0)
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, vout cannot be negative");

        uint32_t nSequence;

        if (rbf.value_or(true)) {
            nSequence = MAX_BIP125_RBF_SEQUENCE; /* CTxIn::SEQUENCE_FINAL - 2 */
        } else if (rawTx.nLockTime) {
            nSequence = CTxIn::MAX_SEQUENCE_NONFINAL; /* CTxIn::SEQUENCE_FINAL - 1 */
        } else {
            nSequence = CTxIn::SEQUENCE_FINAL;
        }

        // set the sequence number if passed in the parameters object
        const UniValue& sequenceObj = o.find_value("sequence");
        if (sequenceObj.isNum()) {
            int64_t seqNr64 = sequenceObj.getInt<int64_t>();
            if (seqNr64 < 0 || seqNr64 > CTxIn::SEQUENCE_FINAL) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, sequence number is out of range");
            } else {
                nSequence = (uint32_t)seqNr64;
            }
        }

        CTxIn in(COutPoint(txid, nOutput), CScript(), nSequence);

        rawTx.vin.push_back(in);
    }
}